

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O3

void readSocket(int sockfd,char *msg)

{
  uint uVar1;
  int iVar2;
  undefined8 in_RAX;
  ulong uVar3;
  ssize_t sVar4;
  char *pcVar5;
  uint *puVar6;
  sockaddr *psVar7;
  undefined4 in_register_0000003c;
  ulong uVar8;
  int dim;
  sockaddr sStack_68;
  ulong uStack_58;
  sockaddr sStack_38;
  char *pcStack_28;
  code *pcStack_20;
  undefined8 uStack_18;
  
  uVar8 = CONCAT44(in_register_0000003c,sockfd);
  pcStack_20 = (code *)0x10296c;
  uStack_18 = in_RAX;
  uVar3 = recv(sockfd,(void *)((long)&uStack_18 + 4),4,0x100);
  if (((int)uVar3 < 0) || ((uVar3 & 0xfffffffc) == 0)) {
    pcStack_20 = (code *)0x1029a7;
    readSocket_cold_2();
  }
  else {
    uVar1 = uStack_18._4_4_ >> 0x18 | (uStack_18._4_4_ & 0xff0000) >> 8 |
            (uStack_18._4_4_ & 0xff00) << 8 | uStack_18._4_4_ << 0x18;
    uStack_18 = CONCAT44(uVar1,(undefined4)uStack_18);
    pcStack_20 = (code *)0x102991;
    uVar8 = (ulong)(uint)sockfd;
    sVar4 = recv(sockfd,msg,(long)(int)uVar1,0x100);
    if ((-1 < (int)sVar4) && ((int)uStack_18._4_4_ <= (int)sVar4)) {
      return;
    }
  }
  pcStack_20 = setupServer;
  readSocket_cold_1();
  pcStack_28 = msg;
  pcStack_20 = (code *)(ulong)(uint)sockfd;
  uVar1 = socket(2,1,0);
  if (uVar1 == 0xffffffff) {
    puts("socket creation failed...");
    exit(-1);
  }
  printf("\x1b[32m[+] Socket successfully created.\n\x1b[0m");
  sStack_38.sa_data[6] = '\0';
  sStack_38.sa_data[7] = '\0';
  sStack_38.sa_data[8] = '\0';
  sStack_38.sa_data[9] = '\0';
  sStack_38.sa_data[10] = '\0';
  sStack_38.sa_data[0xb] = '\0';
  sStack_38.sa_data[0xc] = '\0';
  sStack_38.sa_data[0xd] = '\0';
  sStack_38.sa_family = 2;
  sStack_38.sa_data[2] = '\0';
  sStack_38.sa_data[3] = '\0';
  sStack_38.sa_data[4] = '\0';
  sStack_38.sa_data[5] = '\0';
  sStack_38.sa_data._0_2_ = *(ushort *)(uVar8 + 0x10) << 8 | *(ushort *)(uVar8 + 0x10) >> 8;
  pcVar5 = (char *)(ulong)uVar1;
  iVar2 = bind(uVar1,&sStack_38,0x10);
  if (iVar2 == 0) {
    pcVar5 = (char *)(ulong)uVar1;
    iVar2 = listen(uVar1,10);
    if (iVar2 == 0) {
      printf("\x1b[32m[+] Server listening on %s:%d\x1b[0m\n",uVar8,(ulong)*(uint *)(uVar8 + 0x10));
      return;
    }
  }
  else {
    setupServer_cold_1();
  }
  setupServer_cold_2();
  psVar7 = &sStack_68;
  puVar6 = (uint *)0x1;
  uStack_58 = uVar8;
  uVar1 = socket(2,1,0);
  if (uVar1 == 0xffffffff) {
    pcVar5 = "socket()";
    perror_die("socket()");
  }
  else {
    printf("\x1b[32m[+] Socket successfully created.\n\x1b[0m");
    sStack_68.sa_data[6] = '\0';
    sStack_68.sa_data[7] = '\0';
    sStack_68.sa_data[8] = '\0';
    sStack_68.sa_data[9] = '\0';
    sStack_68.sa_data[10] = '\0';
    sStack_68.sa_data[0xb] = '\0';
    sStack_68.sa_data[0xc] = '\0';
    sStack_68.sa_data[0xd] = '\0';
    sStack_68.sa_family = 2;
    sStack_68.sa_data._2_4_ = inet_addr(pcVar5);
    sStack_68.sa_data._0_2_ = *(ushort *)(pcVar5 + 0x10) << 8 | *(ushort *)(pcVar5 + 0x10) >> 8;
    pcVar5 = (char *)(ulong)uVar1;
    iVar2 = connect(uVar1,&sStack_68,0x10);
    puVar6 = (uint *)psVar7;
    if (iVar2 == 0) {
      printf("\x1b[32m[+] Connected to the server.\n\x1b[0m");
      return;
    }
  }
  setupClient_cold_1();
  if (*(int *)pcVar5 - 1U < 0x11) {
    pcVar5 = &DAT_00105078 + *(int *)(&DAT_00105078 + (ulong)(*(int *)pcVar5 - 1U) * 4);
  }
  else {
    pcVar5 = "INIT";
  }
  printf("\x1b[90mTHREAD #%d: state: %s\x1b[0m\n",(ulong)*puVar6,pcVar5);
  return;
}

Assistant:

void
readSocket(int sockfd, char* msg)
{
    int ret;    // return value
    int dim;    // dimension

    // receive and assign return value to ret for later check
    ret = recv(sockfd, (void*) &dim, sizeof(dim), MSG_WAITALL); // blocking function

    // check ret value
    if (ret < 0 || ret < sizeof(dim)) {
        perror_die("recv(dim)");
    }

    // endianess translation: network2host long
    dim = ntohl(dim);

    #if 0
        // clean data struct, causes a warning so i clean it in the main routine.
        memset(msg, '\0', sizeof(msg));
        // ./utils.h:162:34: warning: 'memset' call operates on objects of type 'char' while the size is based on a different type 'char *' [-Wsizeof-pointer-memaccess]
    #endif

    // get actual data from socket
    ret = recv(sockfd, (void*) msg, dim, MSG_WAITALL);

    // again, check return value
    if (ret < 0 || ret < dim) {
        perror_die("recv(msg)");
    }

    return;
}